

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O2

EmbedLabelNode * __thiscall
asmjit::v1_14::ZoneAllocator::
newT<asmjit::v1_14::EmbedLabelNode,asmjit::v1_14::BaseBuilder*,unsigned_int,unsigned_int>
          (ZoneAllocator *this,BaseBuilder **args,uint *args_1,uint *args_2)

{
  uint uVar1;
  uint uVar2;
  BaseBuilder *pBVar3;
  EmbedLabelNode *pEVar4;
  
  pEVar4 = (EmbedLabelNode *)alloc(this,0x38);
  if (pEVar4 != (EmbedLabelNode *)0x0) {
    pBVar3 = *args;
    uVar1 = *args_1;
    uVar2 = *args_2;
    *(undefined8 *)pEVar4 = 0;
    *(undefined8 *)(pEVar4 + 8) = 0;
    pEVar4[0x10] = (EmbedLabelNode)0x6;
    pEVar4[0x11] = (EmbedLabelNode)(pBVar3->_nodeFlags | kIsData);
    *(undefined8 *)(pEVar4 + 0x12) = 0;
    *(undefined8 *)(pEVar4 + 0x1a) = 0;
    *(undefined8 *)(pEVar4 + 0x20) = 0;
    *(undefined8 *)(pEVar4 + 0x28) = 0;
    *(uint *)(pEVar4 + 0x30) = uVar1;
    *(uint *)(pEVar4 + 0x34) = uVar2;
  }
  return pEVar4;
}

Assistant:

inline T* newT(Args&&... args) noexcept {
    void* p = allocT<T>();
    if (ASMJIT_UNLIKELY(!p))
      return nullptr;
    return new(Support::PlacementNew{p}) T(std::forward<Args>(args)...);
  }